

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask12_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  long in_RAX;
  long unaff_RBX;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x54483c34281c1408));
  vpmovsxbd_avx2(ZEXT816(0x5044383024181004));
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + in_RAX));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBX));
  auVar7 = vpsllvd_avx2(auVar7,_DAT_00195820);
  auVar5 = vpsllvd_avx2(auVar6,_DAT_00195860);
  auVar3 = vpinsrd_avx(ZEXT416(*in),auVar6._0_4_ >> 8 | in[3] << 4,1);
  uVar1 = in[0x16];
  auVar4 = vpinsrd_avx(ZEXT416(auVar6._12_4_ >> 8 | in[0xb] << 4),auVar6._16_4_ >> 4,1);
  auVar4 = vpinsrd_avx(auVar4,in[0x10],2);
  auVar3 = vpinsrd_avx(auVar3,auVar6._4_4_ >> 4,2);
  auVar3 = vpinsrd_avx(auVar3,in[8],3);
  uVar2 = in[0x17];
  auVar4 = vpinsrd_avx(auVar4,auVar6._24_4_ >> 8 | in[0x13] << 4,3);
  auVar8._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
  auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  auVar7 = vpternlogd_avx512vl(auVar5,auVar7,auVar8,0xfe);
  *(undefined1 (*) [32])out = auVar7;
  out[8] = uVar2 << 0x14 | uVar1 << 8 | auVar6._28_4_ >> 4;
  return out + 9;
}

Assistant:

uint32_t *__fastpackwithoutmask12_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;

  return out;
}